

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void idct32_low16_ssse3(__m128i *input,__m128i *output)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  __m128i _in1_2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i _in0;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  __m128i _in1_3;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  __m128i alVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  __m128i _in1;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  __m128i _in1_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 local_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined1 auVar18 [16];
  undefined1 auVar23 [16];
  undefined1 auVar49 [16];
  undefined1 auVar56 [16];
  undefined1 auVar50 [16];
  undefined1 auVar57 [16];
  undefined1 auVar51 [16];
  undefined1 auVar58 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar93 [16];
  undefined1 auVar99 [16];
  undefined1 auVar94 [16];
  undefined1 auVar100 [16];
  undefined1 auVar95 [16];
  undefined1 auVar101 [16];
  undefined1 auVar114 [16];
  undefined1 auVar121 [16];
  undefined1 auVar115 [16];
  undefined1 auVar122 [16];
  undefined1 auVar116 [16];
  undefined1 auVar123 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar149 [16];
  undefined1 auVar154 [16];
  undefined1 auVar150 [16];
  undefined1 auVar155 [16];
  undefined1 auVar151 [16];
  undefined1 auVar156 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  
  auVar2 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar1 = auVar2._0_4_;
  auVar160._4_4_ = uVar1;
  auVar160._0_4_ = uVar1;
  auVar160._8_4_ = uVar1;
  auVar160._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar1 = auVar2._0_4_;
  auVar2._4_4_ = uVar1;
  auVar2._0_4_ = uVar1;
  auVar2._8_4_ = uVar1;
  auVar2._12_4_ = uVar1;
  auVar161 = pmulhrsw(auVar160,(undefined1  [16])input[1]);
  auVar2 = pmulhrsw(auVar2,(undefined1  [16])input[1]);
  auVar61 = pshuflw(ZEXT416(0xffffaa08),ZEXT416(0xffffaa08),0);
  uVar1 = auVar61._0_4_;
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar61 = pshuflw(ZEXT416(0x5ed8),ZEXT416(0x5ed8),0);
  uVar1 = auVar61._0_4_;
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar26 = pmulhrsw(auVar25,(undefined1  [16])input[0xf]);
  auVar63 = pmulhrsw(auVar62,(undefined1  [16])input[0xf]);
  auVar61 = pshuflw(ZEXT416(0x36b8),ZEXT416(0x36b8),0);
  uVar1 = auVar61._0_4_;
  auVar61._4_4_ = uVar1;
  auVar61._0_4_ = uVar1;
  auVar61._8_4_ = uVar1;
  auVar61._12_4_ = uVar1;
  auVar36 = pshuflw(ZEXT416(0x73b8),ZEXT416(0x73b8),0);
  auVar37._0_4_ = auVar36._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar61 = pmulhrsw(auVar61,(undefined1  [16])input[9]);
  auVar38 = pmulhrsw(auVar37,(undefined1  [16])input[9]);
  auVar36 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar1 = auVar36._0_4_;
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar1 = auVar108._0_4_;
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar36 = pmulhrsw(auVar36,(undefined1  [16])input[7]);
  auVar40 = pmulhrsw(auVar39,(undefined1  [16])input[7]);
  auVar108 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar1 = auVar108._0_4_;
  auVar109._4_4_ = uVar1;
  auVar109._0_4_ = uVar1;
  auVar109._8_4_ = uVar1;
  auVar109._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  auVar5._0_4_ = auVar108._0_4_;
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = auVar5._0_4_;
  auVar5._12_4_ = auVar5._0_4_;
  auVar110 = pmulhrsw(auVar109,(undefined1  [16])input[5]);
  auVar6 = pmulhrsw(auVar5,(undefined1  [16])input[5]);
  auVar108 = pshuflw(ZEXT416(0xffffbe30),ZEXT416(0xffffbe30),0);
  uVar1 = auVar108._0_4_;
  auVar125._4_4_ = uVar1;
  auVar125._0_4_ = uVar1;
  auVar125._8_4_ = uVar1;
  auVar125._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x6dc8),ZEXT416(0x6dc8),0);
  uVar1 = auVar108._0_4_;
  auVar7._4_4_ = uVar1;
  auVar7._0_4_ = uVar1;
  auVar7._8_4_ = uVar1;
  auVar7._12_4_ = uVar1;
  auVar126 = pmulhrsw(auVar125,(undefined1  [16])input[0xb]);
  auVar8 = pmulhrsw(auVar7,(undefined1  [16])input[0xb]);
  auVar108 = pshuflw(ZEXT416(0x4c40),ZEXT416(0x4c40),0);
  uVar1 = auVar108._0_4_;
  auVar166._4_4_ = uVar1;
  auVar166._0_4_ = uVar1;
  auVar166._8_4_ = uVar1;
  auVar166._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x66d0),ZEXT416(0x66d0),0);
  uVar1 = auVar108._0_4_;
  auVar181._4_4_ = uVar1;
  auVar181._0_4_ = uVar1;
  auVar181._8_4_ = uVar1;
  auVar181._12_4_ = uVar1;
  auVar167 = pmulhrsw(auVar166,(undefined1  [16])input[0xd]);
  auVar182 = pmulhrsw(auVar181,(undefined1  [16])input[0xd]);
  auVar108 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar1 = auVar108._0_4_;
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  uVar1 = auVar108._0_4_;
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar10 = pmulhrsw(auVar9,(undefined1  [16])input[3]);
  auVar42 = pmulhrsw(auVar41,(undefined1  [16])input[3]);
  auVar108 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar1 = auVar108._0_4_;
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  uVar1 = auVar108._0_4_;
  auVar90._4_4_ = uVar1;
  auVar90._0_4_ = uVar1;
  auVar90._8_4_ = uVar1;
  auVar90._12_4_ = uVar1;
  auVar65 = pmulhrsw(auVar64,(undefined1  [16])input[2]);
  auVar91 = pmulhrsw(auVar90,(undefined1  [16])input[2]);
  auVar108 = pshuflw(ZEXT416(0xffffaed0),ZEXT416(0xffffaed0),0);
  uVar1 = auVar108._0_4_;
  auVar174._4_4_ = uVar1;
  auVar174._0_4_ = uVar1;
  auVar174._8_4_ = uVar1;
  auVar174._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x62f0),ZEXT416(0x62f0),0);
  uVar1 = auVar108._0_4_;
  auVar66._4_4_ = uVar1;
  auVar66._0_4_ = uVar1;
  auVar66._8_4_ = uVar1;
  auVar66._12_4_ = uVar1;
  auVar175 = pmulhrsw(auVar174,(undefined1  [16])input[0xe]);
  auVar67 = pmulhrsw(auVar66,(undefined1  [16])input[0xe]);
  auVar108 = pshuflw(ZEXT416(0x3c58),ZEXT416(0x3c58),0);
  uVar1 = auVar108._0_4_;
  auVar187._4_4_ = uVar1;
  auVar187._0_4_ = uVar1;
  auVar187._8_4_ = uVar1;
  auVar187._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x70e0),ZEXT416(0x70e0),0);
  auVar69._0_4_ = auVar108._0_4_;
  auVar69._4_4_ = auVar69._0_4_;
  auVar69._8_4_ = auVar69._0_4_;
  auVar69._12_4_ = auVar69._0_4_;
  auVar188 = pmulhrsw(auVar187,(undefined1  [16])input[10]);
  auVar3 = pmulhrsw(auVar69,(undefined1  [16])input[10]);
  auVar108 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  uVar1 = auVar108._0_4_;
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  auVar108 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  uVar1 = auVar108._0_4_;
  auVar78._4_4_ = uVar1;
  auVar78._0_4_ = uVar1;
  auVar78._8_4_ = uVar1;
  auVar78._12_4_ = uVar1;
  auVar69 = pmulhrsw(auVar68,(undefined1  [16])input[6]);
  auVar79 = pmulhrsw(auVar78,(undefined1  [16])input[6]);
  auVar141 = paddsw(auVar161,auVar26);
  auVar162 = psubsw(auVar161,auVar26);
  auVar142 = psubsw(auVar36,auVar61);
  auVar27 = paddsw(auVar36,auVar61);
  auVar28 = paddsw(auVar110,auVar126);
  auVar26 = psubsw(auVar110,auVar126);
  auVar127 = psubsw(auVar10,auVar167);
  auVar110 = paddsw(auVar10,auVar167);
  auVar126 = paddsw(auVar42,auVar182);
  auVar42 = psubsw(auVar42,auVar182);
  auVar168 = psubsw(auVar6,auVar8);
  auVar43 = paddsw(auVar8,auVar6);
  auVar161 = paddsw(auVar40,auVar38);
  auVar183 = psubsw(auVar40,auVar38);
  auVar8 = psubsw(auVar2,auVar63);
  auVar167 = paddsw(auVar63,auVar2);
  auVar2 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar1 = auVar2._0_4_;
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0x7d88),ZEXT416(0x7d88),0);
  uVar1 = auVar2._0_4_;
  auVar108._4_4_ = uVar1;
  auVar108._0_4_ = uVar1;
  auVar108._8_4_ = uVar1;
  auVar108._12_4_ = uVar1;
  auVar40 = pmulhrsw(auVar44,(undefined1  [16])input[4]);
  auVar2 = pmulhrsw(auVar108,(undefined1  [16])input[4]);
  auVar61 = pshuflw(ZEXT416(0xffffb8e0),ZEXT416(0xffffb8e0),0);
  uVar1 = auVar61._0_4_;
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar61 = pshuflw(ZEXT416(0x6a70),ZEXT416(0x6a70),0);
  uVar1 = auVar61._0_4_;
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar61 = pmulhrsw(auVar6,(undefined1  [16])input[0xc]);
  auVar46 = pmulhrsw(auVar45,(undefined1  [16])input[0xc]);
  auVar182 = paddsw(auVar65,auVar175);
  auVar36 = psubsw(auVar65,auVar175);
  auVar63 = psubsw(auVar69,auVar188);
  auVar70 = paddsw(auVar69,auVar188);
  auVar47 = paddsw(auVar79,auVar3);
  auVar69 = psubsw(auVar79,auVar3);
  auVar108 = psubsw(auVar91,auVar67);
  auVar65 = paddsw(auVar67,auVar91);
  auVar51._0_12_ = auVar162._0_12_;
  auVar51._12_2_ = auVar162._6_2_;
  auVar51._14_2_ = auVar8._6_2_;
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._0_10_ = auVar162._0_10_;
  auVar50._10_2_ = auVar8._4_2_;
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._0_8_ = auVar162._0_8_;
  auVar49._8_2_ = auVar162._4_2_;
  auVar48._8_8_ = auVar49._8_8_;
  auVar48._6_2_ = auVar8._2_2_;
  auVar48._4_2_ = auVar162._2_2_;
  auVar48._0_2_ = auVar162._0_2_;
  auVar48._2_2_ = auVar8._0_2_;
  auVar163._2_2_ = auVar8._8_2_;
  auVar163._0_2_ = auVar162._8_2_;
  auVar163._4_2_ = auVar162._10_2_;
  auVar163._6_2_ = auVar8._10_2_;
  auVar163._8_2_ = auVar162._12_2_;
  auVar163._10_2_ = auVar8._12_2_;
  auVar163._12_2_ = auVar162._14_2_;
  auVar163._14_2_ = auVar8._14_2_;
  auVar67._8_4_ = 0xfb1031f;
  auVar67._0_8_ = 0xfb1031f0fb1031f;
  auVar67._12_4_ = 0xfb1031f;
  auVar10 = pmaddwd(auVar48,auVar67);
  auVar38 = pmaddwd(auVar163,auVar67);
  auVar79._8_4_ = 0x31ff04f;
  auVar79._0_8_ = 0x31ff04f031ff04f;
  auVar79._12_4_ = 0x31ff04f;
  auVar6 = pmaddwd(auVar48,auVar79);
  auVar8 = pmaddwd(auVar163,auVar79);
  auVar3._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar3._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar3._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar3._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar3,auVar11);
  auVar52._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar164._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar164._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar164._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar164._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  auVar67 = packssdw(auVar52,auVar164);
  auVar95._0_12_ = auVar142._0_12_;
  auVar95._12_2_ = auVar142._6_2_;
  auVar95._14_2_ = auVar183._6_2_;
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._0_10_ = auVar142._0_10_;
  auVar94._10_2_ = auVar183._4_2_;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._0_8_ = auVar142._0_8_;
  auVar93._8_2_ = auVar142._4_2_;
  auVar92._8_8_ = auVar93._8_8_;
  auVar92._6_2_ = auVar183._2_2_;
  auVar92._4_2_ = auVar142._2_2_;
  auVar92._0_2_ = auVar142._0_2_;
  auVar92._2_2_ = auVar183._0_2_;
  auVar143._2_2_ = auVar183._8_2_;
  auVar143._0_2_ = auVar142._8_2_;
  auVar143._4_2_ = auVar142._10_2_;
  auVar143._6_2_ = auVar183._10_2_;
  auVar143._8_2_ = auVar142._12_2_;
  auVar143._10_2_ = auVar183._12_2_;
  auVar143._12_2_ = auVar142._14_2_;
  auVar143._14_2_ = auVar183._14_2_;
  auVar8._8_4_ = 0xf04ffce1;
  auVar8._0_8_ = 0xf04ffce1f04ffce1;
  auVar8._12_4_ = 0xf04ffce1;
  auVar10 = pmaddwd(auVar92,auVar8);
  auVar3 = pmaddwd(auVar8,auVar143);
  auVar8 = pmaddwd(auVar92,auVar79);
  auVar38 = pmaddwd(auVar143,auVar79);
  auVar12._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar10 = packssdw(auVar12,auVar10);
  auVar96._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar144._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar144._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar144._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar144._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  auVar97 = packssdw(auVar96,auVar144);
  auVar192._0_12_ = auVar26._0_12_;
  auVar192._12_2_ = auVar26._6_2_;
  auVar192._14_2_ = auVar168._6_2_;
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._0_10_ = auVar26._0_10_;
  auVar191._10_2_ = auVar168._4_2_;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._0_8_ = auVar26._0_8_;
  auVar190._8_2_ = auVar26._4_2_;
  auVar189._8_8_ = auVar190._8_8_;
  auVar189._6_2_ = auVar168._2_2_;
  auVar189._4_2_ = auVar26._2_2_;
  auVar189._0_2_ = auVar26._0_2_;
  auVar189._2_2_ = auVar168._0_2_;
  auVar111._2_2_ = auVar168._8_2_;
  auVar111._0_2_ = auVar26._8_2_;
  auVar111._4_2_ = auVar26._10_2_;
  auVar111._6_2_ = auVar168._10_2_;
  auVar111._8_2_ = auVar26._12_2_;
  auVar111._10_2_ = auVar168._12_2_;
  auVar111._12_2_ = auVar26._14_2_;
  auVar111._14_2_ = auVar168._14_2_;
  auVar26._8_4_ = 0x8e40d4e;
  auVar26._0_8_ = 0x8e40d4e08e40d4e;
  auVar26._12_4_ = 0x8e40d4e;
  auVar79 = pmaddwd(auVar189,auVar26);
  auVar8 = pmaddwd(auVar111,auVar26);
  auVar38._8_4_ = 0xd4ef71c;
  auVar38._0_8_ = 0xd4ef71c0d4ef71c;
  auVar38._12_4_ = 0xd4ef71c;
  auVar26 = pmaddwd(auVar189,auVar38);
  auVar3 = pmaddwd(auVar111,auVar38);
  auVar169._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar169._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar169._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar169._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar91._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar170 = packssdw(auVar169,auVar91);
  auVar193._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar193._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar193._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar193._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar112._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar194 = packssdw(auVar193,auVar112);
  local_108 = auVar42._0_2_;
  uStack_106 = auVar42._2_2_;
  uStack_104 = auVar42._4_2_;
  uStack_102 = auVar42._6_2_;
  uStack_100 = auVar42._8_2_;
  uStack_fe = auVar42._10_2_;
  uStack_fc = auVar42._12_2_;
  uStack_fa = auVar42._14_2_;
  auVar101._0_12_ = auVar127._0_12_;
  auVar101._12_2_ = auVar127._6_2_;
  auVar101._14_2_ = uStack_102;
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._0_10_ = auVar127._0_10_;
  auVar100._10_2_ = uStack_104;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._0_8_ = auVar127._0_8_;
  auVar99._8_2_ = auVar127._4_2_;
  auVar98._8_8_ = auVar99._8_8_;
  auVar98._6_2_ = uStack_106;
  auVar98._4_2_ = auVar127._2_2_;
  auVar98._0_2_ = auVar127._0_2_;
  auVar98._2_2_ = local_108;
  auVar128._2_2_ = uStack_100;
  auVar128._0_2_ = auVar127._8_2_;
  auVar128._4_2_ = auVar127._10_2_;
  auVar128._6_2_ = uStack_fe;
  auVar128._8_2_ = auVar127._12_2_;
  auVar128._10_2_ = uStack_fc;
  auVar128._12_2_ = auVar127._14_2_;
  auVar128._14_2_ = uStack_fa;
  auVar127._8_4_ = 0xf71cf2b2;
  auVar127._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar127._12_4_ = 0xf71cf2b2;
  auVar42 = pmaddwd(auVar98,auVar127);
  auVar3 = pmaddwd(auVar127,auVar128);
  auVar8 = pmaddwd(auVar98,auVar38);
  auVar26 = pmaddwd(auVar128,auVar38);
  auVar184._0_4_ = auVar42._0_4_ + 0x800 >> 0xc;
  auVar184._4_4_ = auVar42._4_4_ + 0x800 >> 0xc;
  auVar184._8_4_ = auVar42._8_4_ + 0x800 >> 0xc;
  auVar184._12_4_ = auVar42._12_4_ + 0x800 >> 0xc;
  auVar142._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar142._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar142._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar142._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar142 = packssdw(auVar184,auVar142);
  auVar102._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar102._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar102._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar102._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar129._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar129._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar129._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar129._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar91 = packssdw(auVar102,auVar129);
  auVar3 = pshuflw(ZEXT416(0x30f8),ZEXT416(0x30f8),0);
  uVar1 = auVar3._0_4_;
  auVar162._4_4_ = uVar1;
  auVar162._0_4_ = uVar1;
  auVar162._8_4_ = uVar1;
  auVar162._12_4_ = uVar1;
  auVar3 = pshuflw(ZEXT416(0x7640),ZEXT416(0x7640),0);
  uVar1 = auVar3._0_4_;
  auVar145._4_4_ = uVar1;
  auVar145._0_4_ = uVar1;
  auVar145._8_4_ = uVar1;
  auVar145._12_4_ = uVar1;
  auVar8 = pmulhrsw(auVar162,(undefined1  [16])input[8]);
  auVar162 = pmulhrsw(auVar145,(undefined1  [16])input[8]);
  auVar3 = paddsw(auVar40,auVar61);
  auVar26 = psubsw(auVar40,auVar61);
  auVar79 = psubsw(auVar2,auVar46);
  auVar2 = paddsw(auVar46,auVar2);
  local_b8 = auVar108._0_2_;
  uStack_b6 = auVar108._2_2_;
  uStack_b4 = auVar108._4_2_;
  uStack_b2 = auVar108._6_2_;
  uStack_b0 = auVar108._8_2_;
  uStack_ae = auVar108._10_2_;
  uStack_ac = auVar108._12_2_;
  uStack_aa = auVar108._14_2_;
  auVar116._0_12_ = auVar36._0_12_;
  auVar116._12_2_ = auVar36._6_2_;
  auVar116._14_2_ = uStack_b2;
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._0_10_ = auVar36._0_10_;
  auVar115._10_2_ = uStack_b4;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_8_ = auVar36._0_8_;
  auVar114._8_2_ = auVar36._4_2_;
  auVar113._8_8_ = auVar114._8_8_;
  auVar113._6_2_ = uStack_b6;
  auVar113._4_2_ = auVar36._2_2_;
  auVar113._0_2_ = auVar36._0_2_;
  auVar113._2_2_ = local_b8;
  auVar168._2_2_ = uStack_b0;
  auVar168._0_2_ = auVar36._8_2_;
  auVar168._4_2_ = auVar36._10_2_;
  auVar168._6_2_ = uStack_ae;
  auVar168._8_2_ = auVar36._12_2_;
  auVar168._10_2_ = uStack_ac;
  auVar168._12_2_ = auVar36._14_2_;
  auVar168._14_2_ = uStack_aa;
  auVar176._8_4_ = 0x61ff138;
  auVar176._0_8_ = 0x61ff138061ff138;
  auVar176._12_4_ = 0x61ff138;
  auVar36 = pmaddwd(auVar113,auVar176);
  auVar61 = pmaddwd(auVar168,auVar176);
  auVar130._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar130._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar130._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar130._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar40._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar131 = packssdw(auVar130,auVar40);
  auVar71._8_4_ = 0xec8061f;
  auVar71._0_8_ = 0xec8061f0ec8061f;
  auVar71._12_4_ = 0xec8061f;
  auVar36 = pmaddwd(auVar113,auVar71);
  auVar61 = pmaddwd(auVar168,auVar71);
  auVar117._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar117._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar117._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar117._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar42._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar117,auVar42);
  local_e8 = auVar69._0_2_;
  uStack_e6 = auVar69._2_2_;
  uStack_e4 = auVar69._4_2_;
  uStack_e2 = auVar69._6_2_;
  uStack_e0 = auVar69._8_2_;
  uStack_de = auVar69._10_2_;
  uStack_dc = auVar69._12_2_;
  uStack_da = auVar69._14_2_;
  auVar146._0_12_ = auVar63._0_12_;
  auVar146._12_2_ = auVar63._6_2_;
  auVar146._14_2_ = uStack_e2;
  auVar188._12_4_ = auVar146._12_4_;
  auVar188._0_10_ = auVar63._0_10_;
  auVar188._10_2_ = uStack_e4;
  auVar183._10_6_ = auVar188._10_6_;
  auVar183._0_8_ = auVar63._0_8_;
  auVar183._8_2_ = auVar63._4_2_;
  auVar175._8_8_ = auVar183._8_8_;
  auVar175._6_2_ = uStack_e6;
  auVar175._4_2_ = auVar63._2_2_;
  auVar175._0_2_ = auVar63._0_2_;
  auVar175._2_2_ = local_e8;
  auVar29._2_2_ = uStack_e0;
  auVar29._0_2_ = auVar63._8_2_;
  auVar29._4_2_ = auVar63._10_2_;
  auVar29._6_2_ = uStack_de;
  auVar29._8_2_ = auVar63._12_2_;
  auVar29._10_2_ = uStack_dc;
  auVar29._12_2_ = auVar63._14_2_;
  auVar29._14_2_ = uStack_da;
  auVar63._8_4_ = 0xf138f9e1;
  auVar63._0_8_ = 0xf138f9e1f138f9e1;
  auVar63._12_4_ = 0xf138f9e1;
  auVar61 = pmaddwd(auVar175,auVar63);
  auVar36 = pmaddwd(auVar29,auVar63);
  auVar72._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar80._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar80._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar80._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar80._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar127 = packssdw(auVar72,auVar80);
  auVar61 = pmaddwd(auVar175,auVar176);
  auVar36 = pmaddwd(auVar29,auVar176);
  auVar158._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar158._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar158._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar158._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar30._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar38 = packssdw(auVar158,auVar30);
  auVar46 = paddsw(auVar141,auVar27);
  auVar61 = psubsw(auVar141,auVar27);
  auVar40 = paddsw(auVar6,auVar10);
  auVar36 = psubsw(auVar6,auVar10);
  auVar42 = psubsw(auVar110,auVar28);
  auVar28 = paddsw(auVar110,auVar28);
  auVar27 = psubsw(auVar142,auVar170);
  auVar185 = paddsw(auVar142,auVar170);
  auVar188 = paddsw(auVar126,auVar43);
  auVar108 = psubsw(auVar126,auVar43);
  auVar43 = paddsw(auVar91,auVar194);
  auVar175 = psubsw(auVar91,auVar194);
  auVar183 = psubsw(auVar167,auVar161);
  auVar69 = paddsw(auVar167,auVar161);
  auVar167 = psubsw(auVar67,auVar97);
  auVar142 = paddsw(auVar97,auVar67);
  auVar6 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  uVar1 = auVar6._0_4_;
  auVar110._4_4_ = uVar1;
  auVar110._0_4_ = uVar1;
  auVar110._8_4_ = uVar1;
  auVar110._12_4_ = uVar1;
  auVar6 = pmulhrsw(auVar110,(undefined1  [16])*input);
  auVar110 = paddsw(auVar6,auVar162);
  auVar162 = psubsw(auVar6,auVar162);
  auVar67 = paddsw(auVar6,auVar8);
  auVar6 = psubsw(auVar6,auVar8);
  local_68 = auVar79._0_2_;
  uStack_66 = auVar79._2_2_;
  uStack_64 = auVar79._4_2_;
  uStack_62 = auVar79._6_2_;
  uStack_60 = auVar79._8_2_;
  uStack_5e = auVar79._10_2_;
  uStack_5c = auVar79._12_2_;
  uStack_5a = auVar79._14_2_;
  auVar84._0_12_ = auVar26._0_12_;
  auVar84._12_2_ = auVar26._6_2_;
  auVar84._14_2_ = uStack_62;
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._0_10_ = auVar26._0_10_;
  auVar83._10_2_ = uStack_64;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._0_8_ = auVar26._0_8_;
  auVar82._8_2_ = auVar26._4_2_;
  auVar81._8_8_ = auVar82._8_8_;
  auVar81._6_2_ = uStack_66;
  auVar81._4_2_ = auVar26._2_2_;
  auVar81._0_2_ = auVar26._0_2_;
  auVar81._2_2_ = local_68;
  auVar103._2_2_ = uStack_60;
  auVar103._0_2_ = auVar26._8_2_;
  auVar103._4_2_ = auVar26._10_2_;
  auVar103._6_2_ = uStack_5e;
  auVar103._8_2_ = auVar26._12_2_;
  auVar103._10_2_ = uStack_5c;
  auVar103._12_2_ = auVar26._14_2_;
  auVar103._14_2_ = uStack_5a;
  auVar126._8_4_ = 0xb50f4b0;
  auVar126._0_8_ = 0xb50f4b00b50f4b0;
  auVar126._12_4_ = 0xb50f4b0;
  auVar10 = pmaddwd(auVar81,auVar126);
  auVar8 = pmaddwd(auVar103,auVar126);
  auVar195._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar195._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar195._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar195._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar53._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar97 = packssdw(auVar195,auVar53);
  auVar161._8_4_ = 0xb500b50;
  auVar161._0_8_ = 0xb500b500b500b50;
  auVar161._12_4_ = 0xb500b50;
  auVar10 = pmaddwd(auVar81,auVar161);
  auVar8 = pmaddwd(auVar103,auVar161);
  auVar85._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar54._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar168 = packssdw(auVar85,auVar54);
  auVar146 = paddsw(auVar182,auVar70);
  auVar8 = psubsw(auVar182,auVar70);
  auVar91 = paddsw(auVar131,auVar127);
  auVar182 = psubsw(auVar131,auVar127);
  auVar79 = psubsw(auVar65,auVar47);
  auVar10 = paddsw(auVar65,auVar47);
  auVar26 = psubsw(auVar118,auVar38);
  auVar194 = paddsw(auVar38,auVar118);
  auVar58._0_12_ = auVar36._0_12_;
  auVar58._12_2_ = auVar36._6_2_;
  auVar58._14_2_ = auVar167._6_2_;
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._0_10_ = auVar36._0_10_;
  auVar57._10_2_ = auVar167._4_2_;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._0_8_ = auVar36._0_8_;
  auVar56._8_2_ = auVar36._4_2_;
  auVar55._8_8_ = auVar56._8_8_;
  auVar55._6_2_ = auVar167._2_2_;
  auVar55._4_2_ = auVar36._2_2_;
  auVar55._0_2_ = auVar36._0_2_;
  auVar55._2_2_ = auVar167._0_2_;
  auVar73._2_2_ = auVar167._8_2_;
  auVar73._0_2_ = auVar36._8_2_;
  auVar73._4_2_ = auVar36._10_2_;
  auVar73._6_2_ = auVar167._10_2_;
  auVar73._8_2_ = auVar36._12_2_;
  auVar73._10_2_ = auVar167._12_2_;
  auVar73._12_2_ = auVar36._14_2_;
  auVar73._14_2_ = auVar167._14_2_;
  auVar38 = pmaddwd(auVar55,auVar176);
  auVar36 = pmaddwd(auVar73,auVar176);
  auVar177._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar177._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar177._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar177._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  auVar119._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar119._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar119._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar119._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar178 = packssdw(auVar177,auVar119);
  auVar36 = pmaddwd(auVar55,auVar71);
  auVar38 = pmaddwd(auVar73,auVar71);
  auVar59._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar59._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar59._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar59._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar74._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar74._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar74._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar74._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  auVar127 = packssdw(auVar59,auVar74);
  auVar123._0_12_ = auVar61._0_12_;
  auVar123._12_2_ = auVar61._6_2_;
  auVar123._14_2_ = auVar183._6_2_;
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._0_10_ = auVar61._0_10_;
  auVar122._10_2_ = auVar183._4_2_;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._0_8_ = auVar61._0_8_;
  auVar121._8_2_ = auVar61._4_2_;
  auVar120._8_8_ = auVar121._8_8_;
  auVar120._6_2_ = auVar183._2_2_;
  auVar120._4_2_ = auVar61._2_2_;
  auVar120._0_2_ = auVar61._0_2_;
  auVar120._2_2_ = auVar183._0_2_;
  auVar104._2_2_ = auVar183._8_2_;
  auVar104._0_2_ = auVar61._8_2_;
  auVar104._4_2_ = auVar61._10_2_;
  auVar104._6_2_ = auVar183._10_2_;
  auVar104._8_2_ = auVar61._12_2_;
  auVar104._10_2_ = auVar183._12_2_;
  auVar104._12_2_ = auVar61._14_2_;
  auVar104._14_2_ = auVar183._14_2_;
  auVar65 = pmaddwd(auVar120,auVar71);
  auVar36 = pmaddwd(auVar104,auVar71);
  auVar61 = pmaddwd(auVar120,auVar176);
  auVar38 = pmaddwd(auVar104,auVar176);
  auVar75._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar75._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar75._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar75._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar147._0_4_ = auVar38._0_4_ + 0x800 >> 0xc;
  auVar147._4_4_ = auVar38._4_4_ + 0x800 >> 0xc;
  auVar147._8_4_ = auVar38._8_4_ + 0x800 >> 0xc;
  auVar147._12_4_ = auVar38._12_4_ + 0x800 >> 0xc;
  auVar38 = packssdw(auVar75,auVar147);
  auVar124._0_4_ = auVar65._0_4_ + 0x800 >> 0xc;
  auVar124._4_4_ = auVar65._4_4_ + 0x800 >> 0xc;
  auVar124._8_4_ = auVar65._8_4_ + 0x800 >> 0xc;
  auVar124._12_4_ = auVar65._12_4_ + 0x800 >> 0xc;
  auVar105._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar105._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar105._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar105._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar183 = packssdw(auVar124,auVar105);
  local_168 = auVar108._0_2_;
  uStack_166 = auVar108._2_2_;
  uStack_164 = auVar108._4_2_;
  uStack_162 = auVar108._6_2_;
  uStack_160 = auVar108._8_2_;
  uStack_15e = auVar108._10_2_;
  uStack_15c = auVar108._12_2_;
  uStack_15a = auVar108._14_2_;
  auVar151._0_12_ = auVar42._0_12_;
  auVar151._12_2_ = auVar42._6_2_;
  auVar151._14_2_ = uStack_162;
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._0_10_ = auVar42._0_10_;
  auVar150._10_2_ = uStack_164;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._0_8_ = auVar42._0_8_;
  auVar149._8_2_ = auVar42._4_2_;
  auVar148._8_8_ = auVar149._8_8_;
  auVar148._6_2_ = uStack_166;
  auVar148._4_2_ = auVar42._2_2_;
  auVar148._0_2_ = auVar42._0_2_;
  auVar148._2_2_ = local_168;
  auVar47._2_2_ = uStack_160;
  auVar47._0_2_ = auVar42._8_2_;
  auVar47._4_2_ = auVar42._10_2_;
  auVar47._6_2_ = uStack_15e;
  auVar47._8_2_ = auVar42._12_2_;
  auVar47._10_2_ = uStack_15c;
  auVar47._12_2_ = auVar42._14_2_;
  auVar47._14_2_ = uStack_15a;
  auVar36 = pmaddwd(auVar148,auVar63);
  auVar61 = pmaddwd(auVar47,auVar63);
  auVar171._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar106._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar106._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar106._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar106._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar172 = packssdw(auVar171,auVar106);
  auVar36 = pmaddwd(auVar148,auVar176);
  auVar61 = pmaddwd(auVar47,auVar176);
  auVar152._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar152._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar152._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar152._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar70._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar42 = packssdw(auVar152,auVar70);
  local_98 = auVar175._0_2_;
  uStack_96 = auVar175._2_2_;
  uStack_94 = auVar175._4_2_;
  uStack_92 = auVar175._6_2_;
  uStack_90 = auVar175._8_2_;
  uStack_8e = auVar175._10_2_;
  uStack_8c = auVar175._12_2_;
  uStack_8a = auVar175._14_2_;
  auVar156._0_12_ = auVar27._0_12_;
  auVar156._12_2_ = auVar27._6_2_;
  auVar156._14_2_ = uStack_92;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar27._0_10_;
  auVar155._10_2_ = uStack_94;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar27._0_8_;
  auVar154._8_2_ = auVar27._4_2_;
  auVar153._8_8_ = auVar154._8_8_;
  auVar153._6_2_ = uStack_96;
  auVar153._4_2_ = auVar27._2_2_;
  auVar153._0_2_ = auVar27._0_2_;
  auVar153._2_2_ = local_98;
  auVar13._2_2_ = uStack_90;
  auVar13._0_2_ = auVar27._8_2_;
  auVar13._4_2_ = auVar27._10_2_;
  auVar13._6_2_ = uStack_8e;
  auVar13._8_2_ = auVar27._12_2_;
  auVar13._10_2_ = uStack_8c;
  auVar13._12_2_ = auVar27._14_2_;
  auVar13._14_2_ = uStack_8a;
  auVar65 = pmaddwd(auVar153,auVar63);
  auVar36 = pmaddwd(auVar63,auVar13);
  auVar108 = pmaddwd(auVar153,auVar176);
  auVar61 = pmaddwd(auVar13,auVar176);
  auVar186._0_4_ = auVar65._0_4_ + 0x800 >> 0xc;
  auVar186._4_4_ = auVar65._4_4_ + 0x800 >> 0xc;
  auVar186._8_4_ = auVar65._8_4_ + 0x800 >> 0xc;
  auVar186._12_4_ = auVar65._12_4_ + 0x800 >> 0xc;
  auVar31._0_4_ = auVar36._0_4_ + 0x800 >> 0xc;
  auVar31._4_4_ = auVar36._4_4_ + 0x800 >> 0xc;
  auVar31._8_4_ = auVar36._8_4_ + 0x800 >> 0xc;
  auVar31._12_4_ = auVar36._12_4_ + 0x800 >> 0xc;
  auVar175 = packssdw(auVar186,auVar31);
  auVar157._0_4_ = auVar108._0_4_ + 0x800 >> 0xc;
  auVar157._4_4_ = auVar108._4_4_ + 0x800 >> 0xc;
  auVar157._8_4_ = auVar108._8_4_ + 0x800 >> 0xc;
  auVar157._12_4_ = auVar108._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar61._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar61._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar61._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar61._12_4_ + 0x800 >> 0xc;
  auVar158 = packssdw(auVar157,auVar14);
  auVar167 = paddsw(auVar110,auVar2);
  auVar2 = psubsw(auVar110,auVar2);
  auVar63 = paddsw(auVar67,auVar168);
  auVar61 = psubsw(auVar67,auVar168);
  auVar110 = paddsw(auVar6,auVar97);
  auVar36 = psubsw(auVar6,auVar97);
  auVar27 = paddsw(auVar162,auVar3);
  auVar108 = psubsw(auVar162,auVar3);
  local_f8 = auVar26._0_2_;
  uStack_f6 = auVar26._2_2_;
  uStack_f4 = auVar26._4_2_;
  uStack_f2 = auVar26._6_2_;
  uStack_f0 = auVar26._8_2_;
  uStack_ee = auVar26._10_2_;
  uStack_ec = auVar26._12_2_;
  uStack_ea = auVar26._14_2_;
  auVar18._0_12_ = auVar182._0_12_;
  auVar18._12_2_ = auVar182._6_2_;
  auVar18._14_2_ = uStack_f2;
  auVar17._12_4_ = auVar18._12_4_;
  auVar17._0_10_ = auVar182._0_10_;
  auVar17._10_2_ = uStack_f4;
  auVar16._10_6_ = auVar17._10_6_;
  auVar16._0_8_ = auVar182._0_8_;
  auVar16._8_2_ = auVar182._4_2_;
  auVar15._8_8_ = auVar16._8_8_;
  auVar15._6_2_ = uStack_f6;
  auVar15._4_2_ = auVar182._2_2_;
  auVar15._0_2_ = auVar182._0_2_;
  auVar15._2_2_ = local_f8;
  auVar132._2_2_ = uStack_f0;
  auVar132._0_2_ = auVar182._8_2_;
  auVar132._4_2_ = auVar182._10_2_;
  auVar132._6_2_ = uStack_ee;
  auVar132._8_2_ = auVar182._12_2_;
  auVar132._10_2_ = uStack_ec;
  auVar132._12_2_ = auVar182._14_2_;
  auVar132._14_2_ = uStack_ea;
  auVar3 = pmaddwd(auVar15,auVar126);
  auVar6 = pmaddwd(auVar132,auVar126);
  auVar196._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar196._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar196._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar196._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar65._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar65._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar65._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar65._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar197 = packssdw(auVar196,auVar65);
  auVar6 = pmaddwd(auVar15,auVar161);
  auVar3 = pmaddwd(auVar132,auVar161);
  auVar19._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar19._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar19._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar19._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar133._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar182 = packssdw(auVar19,auVar133);
  local_a8 = auVar79._0_2_;
  uStack_a6 = auVar79._2_2_;
  uStack_a4 = auVar79._4_2_;
  uStack_a2 = auVar79._6_2_;
  uStack_a0 = auVar79._8_2_;
  uStack_9e = auVar79._10_2_;
  uStack_9c = auVar79._12_2_;
  uStack_9a = auVar79._14_2_;
  auVar141._0_12_ = auVar8._0_12_;
  auVar141._12_2_ = auVar8._6_2_;
  auVar141._14_2_ = uStack_a2;
  auVar131._12_4_ = auVar141._12_4_;
  auVar131._0_10_ = auVar8._0_10_;
  auVar131._10_2_ = uStack_a4;
  auVar118._10_6_ = auVar131._10_6_;
  auVar118._0_8_ = auVar8._0_8_;
  auVar118._8_2_ = auVar8._4_2_;
  auVar97._8_8_ = auVar118._8_8_;
  auVar97._6_2_ = uStack_a6;
  auVar97._4_2_ = auVar8._2_2_;
  auVar97._0_2_ = auVar8._0_2_;
  auVar97._2_2_ = local_a8;
  auVar134._2_2_ = uStack_a0;
  auVar134._0_2_ = auVar8._8_2_;
  auVar134._4_2_ = auVar8._10_2_;
  auVar134._6_2_ = uStack_9e;
  auVar134._8_2_ = auVar8._12_2_;
  auVar134._10_2_ = uStack_9c;
  auVar134._12_2_ = auVar8._14_2_;
  auVar134._14_2_ = uStack_9a;
  auVar6 = pmaddwd(auVar97,auVar126);
  auVar3 = pmaddwd(auVar134,auVar126);
  auVar32._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar86._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar79 = packssdw(auVar32,auVar86);
  auVar6 = pmaddwd(auVar97,auVar161);
  auVar3 = pmaddwd(auVar134,auVar161);
  auVar170._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar170._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar170._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar170._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar135._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar65 = packssdw(auVar170,auVar135);
  auVar6 = paddsw(auVar46,auVar28);
  auVar162 = psubsw(auVar46,auVar28);
  auVar3 = paddsw(auVar40,auVar185);
  auVar168 = psubsw(auVar40,auVar185);
  auVar8 = paddsw(auVar178,auVar175);
  auVar70 = psubsw(auVar178,auVar175);
  auVar26 = paddsw(auVar38,auVar172);
  auVar46 = psubsw(auVar38,auVar172);
  auVar175 = psubsw(auVar69,auVar188);
  auVar38 = paddsw(auVar69,auVar188);
  auVar188 = psubsw(auVar142,auVar43);
  auVar40 = paddsw(auVar142,auVar43);
  auVar43 = psubsw(auVar127,auVar158);
  auVar158 = paddsw(auVar158,auVar127);
  auVar28 = psubsw(auVar183,auVar42);
  auVar42 = paddsw(auVar42,auVar183);
  auVar97 = paddsw(auVar167,auVar10);
  auVar127 = psubsw(auVar167,auVar10);
  auVar47 = paddsw(auVar63,auVar194);
  auVar142 = psubsw(auVar63,auVar194);
  auVar183 = paddsw(auVar110,auVar182);
  auVar10 = psubsw(auVar110,auVar182);
  auVar67 = paddsw(auVar27,auVar65);
  auVar63 = psubsw(auVar27,auVar65);
  auVar65 = paddsw(auVar108,auVar79);
  auVar108 = psubsw(auVar108,auVar79);
  auVar69 = paddsw(auVar36,auVar197);
  auVar36 = psubsw(auVar36,auVar197);
  auVar118 = paddsw(auVar61,auVar91);
  auVar61 = psubsw(auVar61,auVar91);
  auVar79 = paddsw(auVar2,auVar146);
  auVar2 = psubsw(auVar2,auVar146);
  auVar23._0_12_ = auVar46._0_12_;
  auVar23._12_2_ = auVar46._6_2_;
  auVar23._14_2_ = auVar28._6_2_;
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = auVar46._0_10_;
  auVar22._10_2_ = auVar28._4_2_;
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._0_8_ = auVar46._0_8_;
  auVar21._8_2_ = auVar46._4_2_;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._6_2_ = auVar28._2_2_;
  auVar20._4_2_ = auVar46._2_2_;
  auVar20._0_2_ = auVar46._0_2_;
  auVar20._2_2_ = auVar28._0_2_;
  auVar76._2_2_ = auVar28._8_2_;
  auVar76._0_2_ = auVar46._8_2_;
  auVar76._4_2_ = auVar46._10_2_;
  auVar76._6_2_ = auVar28._10_2_;
  auVar76._8_2_ = auVar46._12_2_;
  auVar76._10_2_ = auVar28._12_2_;
  auVar76._12_2_ = auVar46._14_2_;
  auVar76._14_2_ = auVar28._14_2_;
  auVar27 = pmaddwd(auVar20,auVar126);
  auVar110 = pmaddwd(auVar76,auVar126);
  auVar173._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar173._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar173._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar173._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar27._0_4_ = auVar110._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar110._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar110._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar110._12_4_ + 0x800 >> 0xc;
  auVar146 = packssdw(auVar173,auVar27);
  auVar110 = pmaddwd(auVar20,auVar161);
  auVar27 = pmaddwd(auVar76,auVar161);
  auVar24._0_4_ = auVar110._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar110._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar110._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar110._12_4_ + 0x800 >> 0xc;
  auVar77._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar91 = packssdw(auVar24,auVar77);
  auVar167._0_12_ = auVar70._0_12_;
  auVar167._12_2_ = auVar70._6_2_;
  auVar167._14_2_ = auVar43._6_2_;
  auVar46._12_4_ = auVar167._12_4_;
  auVar46._0_10_ = auVar70._0_10_;
  auVar46._10_2_ = auVar43._4_2_;
  auVar182._10_6_ = auVar46._10_6_;
  auVar182._0_8_ = auVar70._0_8_;
  auVar182._8_2_ = auVar70._4_2_;
  auVar28._8_8_ = auVar182._8_8_;
  auVar28._6_2_ = auVar43._2_2_;
  auVar28._4_2_ = auVar70._2_2_;
  auVar28._0_2_ = auVar70._0_2_;
  auVar28._2_2_ = auVar43._0_2_;
  auVar179._2_2_ = auVar43._8_2_;
  auVar179._0_2_ = auVar70._8_2_;
  auVar179._4_2_ = auVar70._10_2_;
  auVar179._6_2_ = auVar43._10_2_;
  auVar179._8_2_ = auVar70._12_2_;
  auVar179._10_2_ = auVar43._12_2_;
  auVar179._12_2_ = auVar70._14_2_;
  auVar179._14_2_ = auVar43._14_2_;
  auVar27 = pmaddwd(auVar28,auVar126);
  auVar110 = pmaddwd(auVar179,auVar126);
  auVar159._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar159._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar159._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar159._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar194._0_4_ = auVar110._0_4_ + 0x800 >> 0xc;
  auVar194._4_4_ = auVar110._4_4_ + 0x800 >> 0xc;
  auVar194._8_4_ = auVar110._8_4_ + 0x800 >> 0xc;
  auVar194._12_4_ = auVar110._12_4_ + 0x800 >> 0xc;
  auVar46 = packssdw(auVar159,auVar194);
  auVar110 = pmaddwd(auVar28,auVar161);
  auVar27 = pmaddwd(auVar179,auVar161);
  auVar43._0_4_ = auVar110._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar110._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar110._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar110._12_4_ + 0x800 >> 0xc;
  auVar180._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar180._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar180._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar180._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar110 = packssdw(auVar43,auVar180);
  auVar185._0_12_ = auVar168._0_12_;
  auVar185._12_2_ = auVar168._6_2_;
  auVar185._14_2_ = auVar188._6_2_;
  auVar197._12_4_ = auVar185._12_4_;
  auVar197._0_10_ = auVar168._0_10_;
  auVar197._10_2_ = auVar188._4_2_;
  auVar172._10_6_ = auVar197._10_6_;
  auVar172._0_8_ = auVar168._0_8_;
  auVar172._8_2_ = auVar168._4_2_;
  auVar178._8_8_ = auVar172._8_8_;
  auVar178._6_2_ = auVar188._2_2_;
  auVar178._4_2_ = auVar168._2_2_;
  auVar178._0_2_ = auVar168._0_2_;
  auVar178._2_2_ = auVar188._0_2_;
  auVar33._2_2_ = auVar188._8_2_;
  auVar33._0_2_ = auVar168._8_2_;
  auVar33._4_2_ = auVar168._10_2_;
  auVar33._6_2_ = auVar188._10_2_;
  auVar33._8_2_ = auVar168._12_2_;
  auVar33._10_2_ = auVar188._12_2_;
  auVar33._12_2_ = auVar168._14_2_;
  auVar33._14_2_ = auVar188._14_2_;
  auVar27 = pmaddwd(auVar178,auVar126);
  auVar28 = pmaddwd(auVar33,auVar126);
  auVar60._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar87._0_4_ = auVar28._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar28._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar28._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar28._12_4_ + 0x800 >> 0xc;
  auVar167 = packssdw(auVar60,auVar87);
  auVar27 = pmaddwd(auVar178,auVar161);
  auVar28 = pmaddwd(auVar33,auVar161);
  auVar4._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar4._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar4._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar4._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar34._0_4_ = auVar28._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar28._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar28._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar28._12_4_ + 0x800 >> 0xc;
  auVar27 = packssdw(auVar4,auVar34);
  local_a8 = auVar175._0_2_;
  uStack_a6 = auVar175._2_2_;
  uStack_a4 = auVar175._4_2_;
  uStack_a2 = auVar175._6_2_;
  uStack_a0 = auVar175._8_2_;
  uStack_9e = auVar175._10_2_;
  uStack_9c = auVar175._12_2_;
  uStack_9a = auVar175._14_2_;
  auVar139._0_12_ = auVar162._0_12_;
  auVar139._12_2_ = auVar162._6_2_;
  auVar139._14_2_ = uStack_a2;
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._0_10_ = auVar162._0_10_;
  auVar138._10_2_ = uStack_a4;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._0_8_ = auVar162._0_8_;
  auVar137._8_2_ = auVar162._4_2_;
  auVar136._8_8_ = auVar137._8_8_;
  auVar136._6_2_ = uStack_a6;
  auVar136._4_2_ = auVar162._2_2_;
  auVar136._0_2_ = auVar162._0_2_;
  auVar136._2_2_ = local_a8;
  auVar88._2_2_ = uStack_a0;
  auVar88._0_2_ = auVar162._8_2_;
  auVar88._4_2_ = auVar162._10_2_;
  auVar88._6_2_ = uStack_9e;
  auVar88._8_2_ = auVar162._12_2_;
  auVar88._10_2_ = uStack_9c;
  auVar88._12_2_ = auVar162._14_2_;
  auVar88._14_2_ = uStack_9a;
  auVar28 = pmaddwd(auVar136,auVar126);
  auVar126 = pmaddwd(auVar126,auVar88);
  auVar182 = pmaddwd(auVar136,auVar161);
  auVar161 = pmaddwd(auVar88,auVar161);
  auVar35._0_4_ = auVar28._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar28._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar28._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar28._12_4_ + 0x800 >> 0xc;
  auVar107._0_4_ = auVar126._0_4_ + 0x800 >> 0xc;
  auVar107._4_4_ = auVar126._4_4_ + 0x800 >> 0xc;
  auVar107._8_4_ = auVar126._8_4_ + 0x800 >> 0xc;
  auVar107._12_4_ = auVar126._12_4_ + 0x800 >> 0xc;
  auVar126 = packssdw(auVar35,auVar107);
  auVar140._0_4_ = auVar182._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar182._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar182._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar182._12_4_ + 0x800 >> 0xc;
  auVar89._0_4_ = auVar161._0_4_ + 0x800 >> 0xc;
  auVar89._4_4_ = auVar161._4_4_ + 0x800 >> 0xc;
  auVar89._8_4_ = auVar161._8_4_ + 0x800 >> 0xc;
  auVar89._12_4_ = auVar161._12_4_ + 0x800 >> 0xc;
  auVar161 = packssdw(auVar140,auVar89);
  alVar165 = (__m128i)paddsw(auVar97,auVar38);
  *output = alVar165;
  alVar165 = (__m128i)psubsw(auVar97,auVar38);
  output[0x1f] = alVar165;
  alVar165 = (__m128i)paddsw(auVar47,auVar40);
  output[1] = alVar165;
  alVar165 = (__m128i)psubsw(auVar47,auVar40);
  output[0x1e] = alVar165;
  alVar165 = (__m128i)paddsw(auVar183,auVar158);
  output[2] = alVar165;
  alVar165 = (__m128i)psubsw(auVar183,auVar158);
  output[0x1d] = alVar165;
  alVar165 = (__m128i)paddsw(auVar67,auVar42);
  output[3] = alVar165;
  alVar165 = (__m128i)psubsw(auVar67,auVar42);
  output[0x1c] = alVar165;
  alVar165 = (__m128i)paddsw(auVar65,auVar91);
  output[4] = alVar165;
  alVar165 = (__m128i)psubsw(auVar65,auVar91);
  output[0x1b] = alVar165;
  alVar165 = (__m128i)paddsw(auVar69,auVar110);
  output[5] = alVar165;
  alVar165 = (__m128i)psubsw(auVar69,auVar110);
  output[0x1a] = alVar165;
  alVar165 = (__m128i)paddsw(auVar118,auVar27);
  output[6] = alVar165;
  alVar165 = (__m128i)psubsw(auVar118,auVar27);
  output[0x19] = alVar165;
  alVar165 = (__m128i)paddsw(auVar79,auVar161);
  output[7] = alVar165;
  alVar165 = (__m128i)psubsw(auVar79,auVar161);
  output[0x18] = alVar165;
  alVar165 = (__m128i)paddsw(auVar2,auVar126);
  output[8] = alVar165;
  alVar165 = (__m128i)psubsw(auVar2,auVar126);
  output[0x17] = alVar165;
  alVar165 = (__m128i)paddsw(auVar61,auVar167);
  output[9] = alVar165;
  alVar165 = (__m128i)psubsw(auVar61,auVar167);
  output[0x16] = alVar165;
  alVar165 = (__m128i)paddsw(auVar36,auVar46);
  output[10] = alVar165;
  alVar165 = (__m128i)psubsw(auVar36,auVar46);
  output[0x15] = alVar165;
  alVar165 = (__m128i)paddsw(auVar108,auVar146);
  output[0xb] = alVar165;
  alVar165 = (__m128i)psubsw(auVar108,auVar146);
  output[0x14] = alVar165;
  alVar165 = (__m128i)paddsw(auVar63,auVar26);
  output[0xc] = alVar165;
  alVar165 = (__m128i)psubsw(auVar63,auVar26);
  output[0x13] = alVar165;
  alVar165 = (__m128i)paddsw(auVar10,auVar8);
  output[0xd] = alVar165;
  alVar165 = (__m128i)psubsw(auVar10,auVar8);
  output[0x12] = alVar165;
  alVar165 = (__m128i)paddsw(auVar142,auVar3);
  output[0xe] = alVar165;
  alVar165 = (__m128i)psubsw(auVar142,auVar3);
  output[0x11] = alVar165;
  alVar165 = (__m128i)paddsw(auVar127,auVar6);
  output[0xf] = alVar165;
  alVar165 = (__m128i)psubsw(auVar127,auVar6);
  output[0x10] = alVar165;
  return;
}

Assistant:

static void idct32_low16_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[2] = input[8];
  x[4] = input[4];
  x[6] = input[12];
  x[8] = input[2];
  x[10] = input[10];
  x[12] = input[6];
  x[14] = input[14];
  x[16] = input[1];
  x[18] = input[9];
  x[20] = input[5];
  x[22] = input[13];
  x[24] = input[3];
  x[26] = input[11];
  x[28] = input[7];
  x[30] = input[15];

  // stage 2
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_ssse3(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_ssse3(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);

  // stage 3
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  idct32_high16_stage3_sse2(x);

  // stage 4
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);

  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}